

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,int64_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  int64_t iVar3;
  TPZEqnArray<long_double> *pTVar4;
  ulong uVar5;
  long lVar6;
  TPZEqnArray<long_double> *pTVar7;
  
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = (TPZEqnArray<long_double> *)0x0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = 0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019b6140;
  pTVar4 = (TPZEqnArray<long_double> *)&this->field_0x20;
  lVar6 = 0;
  pTVar7 = pTVar4;
  do {
    TPZEqnArray<long_double>::TPZEqnArray(pTVar7);
    lVar6 = lVar6 + -0x51e0;
    pTVar7 = pTVar7 + 1;
  } while (lVar6 != -0x332c0);
  if (size < 0xb) {
    iVar3 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x51e0),8) == 0) {
      uVar5 = SUB168(auVar1 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar2 = operator_new__(uVar5);
    *(int64_t *)((long)pvVar2 + 8) = size;
    pTVar4 = (TPZEqnArray<long_double> *)((long)pvVar2 + 0x10);
    lVar6 = 0;
    pTVar7 = pTVar4;
    do {
      TPZEqnArray<long_double>::TPZEqnArray(pTVar7);
      lVar6 = lVar6 + -0x51e0;
      pTVar7 = pTVar7 + 1;
      iVar3 = size;
    } while (size * -0x51e0 - lVar6 != 0);
  }
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = pTVar4;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = size;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = iVar3;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}